

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpack.c
# Opt level: O1

size_t mpack_expect_enum(mpack_reader_t *reader,char **strings,size_t count)

{
  char *__s;
  bool bVar1;
  uint32_t uVar2;
  int iVar3;
  char *__s1;
  size_t sVar4;
  size_t sVar5;
  ulong count_00;
  size_t sVar6;
  bool bVar7;
  size_t local_40;
  
  uVar2 = mpack_expect_str(reader);
  count_00 = (ulong)uVar2;
  __s1 = mpack_read_bytes_inplace_notrack(reader,count_00);
  sVar5 = count;
  if (reader->error == mpack_ok) {
    bVar7 = count != 0;
    if (bVar7) {
      sVar6 = 0;
      do {
        __s = strings[sVar6];
        sVar4 = strlen(__s);
        if ((sVar4 == count_00) && (iVar3 = bcmp(__s1,__s,count_00), iVar3 == 0)) {
          bVar1 = false;
          local_40 = sVar6;
        }
        else {
          bVar1 = true;
        }
        sVar5 = local_40;
        if (!bVar1) break;
        sVar6 = sVar6 + 1;
        bVar7 = sVar6 < count;
        sVar5 = count;
      } while (sVar6 != count);
    }
    if (!bVar7) {
      reader->error = mpack_error_type;
      reader->end = reader->data;
      sVar5 = count;
      if (reader->error_fn != (mpack_reader_error_t)0x0) {
        (*reader->error_fn)(reader,mpack_error_type);
      }
    }
  }
  return sVar5;
}

Assistant:

size_t mpack_expect_enum(mpack_reader_t* reader, const char* strings[], size_t count) {

    // read the string in-place
    size_t keylen = mpack_expect_str(reader);
    const char* key = mpack_read_bytes_inplace(reader, keylen);
    mpack_done_str(reader);
    if (mpack_reader_error(reader) != mpack_ok)
        return count;

    // find what key it matches
    for (size_t i = 0; i < count; ++i) {
        const char* other = strings[i];
        size_t otherlen = mpack_strlen(other);
        if (keylen == otherlen && mpack_memcmp(key, other, keylen) == 0)
            return i;
    }

    // no matches
    mpack_reader_flag_error(reader, mpack_error_type);
    return count;
}